

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_dropout.cpp
# Opt level: O0

int test_dropout(Mat *a,float scale)

{
  int iVar1;
  long in_RDI;
  float in_XMM0_Da;
  int ret;
  Option opt;
  vector<ncnn::Mat,_std::allocator<ncnn::Mat>_> weights;
  ParamDict pd;
  Option *this;
  undefined4 in_stack_fffffffffffff690;
  undefined4 in_stack_fffffffffffff694;
  int iVar2;
  undefined4 in_stack_fffffffffffff698;
  undefined4 in_stack_fffffffffffff69c;
  vector<ncnn::Mat,_std::allocator<ncnn::Mat>_> *in_stack_fffffffffffff6a0;
  ParamDict *in_stack_fffffffffffff6c0;
  _func_void_Dropout_ptr *in_stack_fffffffffffff8f8;
  float in_stack_fffffffffffff904;
  Mat *in_stack_fffffffffffff908;
  Option *in_stack_fffffffffffff910;
  vector<ncnn::Mat,_std::allocator<ncnn::Mat>_> *in_stack_fffffffffffff918;
  ParamDict *in_stack_fffffffffffff920;
  char *in_stack_fffffffffffff928;
  
  ncnn::ParamDict::ParamDict(in_stack_fffffffffffff6c0);
  ncnn::ParamDict::set((ParamDict *)&stack0xfffffffffffff6f0,0,in_XMM0_Da);
  this = (Option *)&stack0xfffffffffffff6c7;
  std::allocator<ncnn::Mat>::allocator((allocator<ncnn::Mat> *)0x116ddd);
  std::vector<ncnn::Mat,_std::allocator<ncnn::Mat>_>::vector
            (in_stack_fffffffffffff6a0,CONCAT44(in_stack_fffffffffffff69c,in_stack_fffffffffffff698)
             ,(allocator_type *)CONCAT44(in_stack_fffffffffffff694,in_stack_fffffffffffff690));
  std::allocator<ncnn::Mat>::~allocator((allocator<ncnn::Mat> *)0x116dfc);
  ncnn::Option::Option(this);
  iVar1 = test_layer<ncnn::Dropout>
                    (in_stack_fffffffffffff928,in_stack_fffffffffffff920,in_stack_fffffffffffff918,
                     in_stack_fffffffffffff910,in_stack_fffffffffffff908,in_stack_fffffffffffff904,
                     in_stack_fffffffffffff8f8);
  if (iVar1 != 0) {
    fprintf(_stderr,"test_dropout failed a.dims=%d a=(%d %d %d) scale=%f\n",(double)in_XMM0_Da,
            (ulong)*(uint *)(in_RDI + 0x28),(ulong)*(uint *)(in_RDI + 0x2c),
            (ulong)*(uint *)(in_RDI + 0x30),(ulong)*(uint *)(in_RDI + 0x34));
  }
  iVar2 = iVar1;
  std::vector<ncnn::Mat,_std::allocator<ncnn::Mat>_>::~vector
            ((vector<ncnn::Mat,_std::allocator<ncnn::Mat>_> *)
             CONCAT44(iVar1,in_stack_fffffffffffff690));
  ncnn::ParamDict::~ParamDict((ParamDict *)CONCAT44(iVar2,in_stack_fffffffffffff690));
  return iVar1;
}

Assistant:

static int test_dropout(const ncnn::Mat& a, float scale)
{
    ncnn::ParamDict pd;
    pd.set(0, scale);

    std::vector<ncnn::Mat> weights(0);

    ncnn::Option opt;
    opt.num_threads = 1;
    opt.use_vulkan_compute = true;
    opt.use_int8_inference = false;

    int ret = test_layer<ncnn::Dropout>("Dropout", pd, weights, opt, a);
    if (ret != 0)
    {
        fprintf(stderr, "test_dropout failed a.dims=%d a=(%d %d %d) scale=%f\n", a.dims, a.w, a.h, a.c, scale);
    }

    return ret;
}